

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sit.c
# Opt level: O0

void attrcurse(void)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  
  iVar2 = rnd(0xb);
  switch(iVar2) {
  case 1:
    if ((u.uprops[1].intrinsic & 0x4000000) != 0) {
      u.uprops[1].intrinsic = u.uprops[1].intrinsic & 0xfbffffff;
      pline("You feel warmer.");
      return;
    }
    break;
  case 2:
    break;
  case 3:
    goto switchD_002d7495_caseD_3;
  case 4:
    goto switchD_002d7495_caseD_4;
  case 5:
    goto switchD_002d7495_caseD_5;
  case 6:
    goto switchD_002d7495_caseD_6;
  case 7:
    goto switchD_002d7495_caseD_7;
  case 8:
    goto switchD_002d7495_caseD_8;
  case 9:
    goto switchD_002d7495_caseD_9;
  case 10:
    goto switchD_002d7495_caseD_a;
  case 0xb:
    goto switchD_002d7495_caseD_b;
  default:
    goto switchD_002d7495_default;
  }
  if ((u.uprops[0xe].intrinsic & 0x4000000) == 0) {
switchD_002d7495_caseD_3:
    if ((u.uprops[6].intrinsic & 0x4000000) == 0) {
switchD_002d7495_caseD_4:
      if ((u.uprops[0x19].intrinsic & 0x4000000) == 0) {
switchD_002d7495_caseD_5:
        if ((u.uprops[2].intrinsic & 0x4000000) == 0) {
switchD_002d7495_caseD_6:
          if ((u.uprops[0xd].intrinsic & 0x4000000) == 0) {
switchD_002d7495_caseD_7:
            if ((u.uprops[0xc].intrinsic & 0x4000000) == 0) {
switchD_002d7495_caseD_8:
              if ((u.uprops[0x1a].intrinsic & 0x4000000) == 0) {
switchD_002d7495_caseD_9:
                if ((u.uprops[0x13].intrinsic & 0x4000000) == 0) {
switchD_002d7495_caseD_a:
                  if ((u.uprops[0x16].intrinsic & 0x4000000) == 0) {
switchD_002d7495_caseD_b:
                    if ((u.uprops[0x14].intrinsic & 0x4000000) != 0) {
                      u.uprops[0x14].intrinsic = u.uprops[0x14].intrinsic & 0xfbffffff;
                      pline("You feel less attractive.");
                    }
                  }
                  else {
                    u.uprops[0x16].intrinsic = u.uprops[0x16].intrinsic & 0xfbffffff;
                    pline("You feel vulnerable.");
                    u.ublessed = 0;
                  }
                }
                else {
                  u.uprops[0x13].intrinsic = u.uprops[0x13].intrinsic & 0xfbffffff;
                  pline("You feel clumsy.");
                }
              }
              else {
                u.uprops[0x1a].intrinsic = u.uprops[0x1a].intrinsic & 0xfbffffff;
                pline("You feel slower.");
              }
            }
            else {
              u.uprops[0xc].intrinsic = u.uprops[0xc].intrinsic & 0xfbffffff;
              bVar4 = false;
              if (u.uprops[0x23].intrinsic != 0) {
                bVar4 = true;
                if ((u.uprops[0x24].extrinsic == 0) && (bVar4 = false, u.umonnum != u.umonster)) {
                  bVar1 = dmgtype(youmonst.data,0x24);
                  bVar4 = bVar1 != '\0';
                }
                bVar4 = (bool)(bVar4 ^ 1);
              }
              pcVar3 = "thought you saw something";
              if (bVar4) {
                pcVar3 = "tawt you taw a puttie tat";
              }
              pline("You %s!",pcVar3);
            }
          }
          else {
            u.uprops[0xd].intrinsic = u.uprops[0xd].intrinsic & 0xfbffffff;
            pline("You feel paranoid.");
          }
        }
        else {
          u.uprops[2].intrinsic = u.uprops[2].intrinsic & 0xfbffffff;
          pline("You feel cooler.");
        }
      }
      else {
        u.uprops[0x19].intrinsic = u.uprops[0x19].intrinsic & 0xfbffffff;
        if ((((u.uprops[0x1e].intrinsic != 0) ||
             (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
              (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
            ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) &&
           (((u.uprops[0x19].intrinsic == 0 &&
             (((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)) &&
              ((youmonst.data != mons + 0x31 && (youmonst.data != mons + 0x32)))))) ||
            (u.uprops[0x19].blocked != 0)))) {
          see_monsters();
        }
        pline("Your senses fail!");
      }
    }
    else {
      u.uprops[6].intrinsic = u.uprops[6].intrinsic & 0xfbffffff;
      pline("You feel a little sick!");
    }
  }
  else {
    u.uprops[0xe].intrinsic = u.uprops[0xe].intrinsic & 0xfbffffff;
    pline("You feel less jumpy.");
  }
switchD_002d7495_default:
  return;
}

Assistant:

void attrcurse(void)
{
	switch(rnd(11)) {
	case 1 : if (HFire_resistance & FROMOUTSIDE) {
			HFire_resistance &= ~FROMOUTSIDE;
			pline("You feel warmer.");
			break;
		}
	case 2 : if (HTeleportation & FROMOUTSIDE) {
			HTeleportation &= ~FROMOUTSIDE;
			pline("You feel less jumpy.");
			break;
		}
	case 3 : if (HPoison_resistance & FROMOUTSIDE) {
			HPoison_resistance &= ~FROMOUTSIDE;
			pline("You feel a little sick!");
			break;
		}
	case 4 : if (HTelepat & FROMOUTSIDE) {
			HTelepat &= ~FROMOUTSIDE;
			if (Blind && !Blind_telepat)
			    see_monsters();	/* Can't sense mons anymore! */
			pline("Your senses fail!");
			break;
		}
	case 5 : if (HCold_resistance & FROMOUTSIDE) {
			HCold_resistance &= ~FROMOUTSIDE;
			pline("You feel cooler.");
			break;
		}
	case 6 : if (HInvis & FROMOUTSIDE) {
			HInvis &= ~FROMOUTSIDE;
			pline("You feel paranoid.");
			break;
		}
	case 7 : if (HSee_invisible & FROMOUTSIDE) {
			HSee_invisible &= ~FROMOUTSIDE;
			pline("You %s!", Hallucination ? "tawt you taw a puttie tat"
						: "thought you saw something");
			break;
		}
	case 8 : if (HFast & FROMOUTSIDE) {
			HFast &= ~FROMOUTSIDE;
			pline("You feel slower.");
			break;
		}
	case 9 : if (HStealth & FROMOUTSIDE) {
			HStealth &= ~FROMOUTSIDE;
			pline("You feel clumsy.");
			break;
		}
	case 10: if (HProtection & FROMOUTSIDE) {
			HProtection &= ~FROMOUTSIDE;
			pline("You feel vulnerable.");
			u.ublessed = 0;
			break;
		}
	case 11: if (HAggravate_monster & FROMOUTSIDE) {
			HAggravate_monster &= ~FROMOUTSIDE;
			pline("You feel less attractive.");
			break;
		}
	default: break;
	}
}